

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

Interval __thiscall pbrt::Interval::operator*(Interval *this,Interval i)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  float fVar4;
  bool bVar5;
  float *__result;
  float *pfVar6;
  float *pfVar7;
  long lVar8;
  undefined1 in_register_00001208 [56];
  undefined1 auVar9 [64];
  float local_20 [4];
  float local_10 [4];
  
  auVar9._8_56_ = in_register_00001208;
  auVar9._0_8_ = i;
  local_20[0] = i.low * this->low;
  local_10[0] = local_20[0];
  if (-INFINITY < local_20[0]) {
    uVar3 = vcmpss_avx512f(ZEXT416((uint)local_20[0]),ZEXT816(0) << 0x40,0);
    bVar5 = (bool)((byte)uVar3 & 1);
    fVar4 = (float)((uint)bVar5 * -0x80000000 + (uint)!bVar5 * (int)local_20[0]);
    local_10[0] = (float)((int)fVar4 + -1 + (uint)(fVar4 <= 0.0) * 2);
  }
  local_20[1] = this->high * i.low;
  local_10[1] = local_20[1];
  if (-INFINITY < local_20[1]) {
    uVar3 = vcmpss_avx512f(ZEXT416((uint)local_20[1]),ZEXT816(0),0);
    bVar5 = (bool)((byte)uVar3 & 1);
    fVar4 = (float)((uint)bVar5 * -0x80000000 + (uint)!bVar5 * (int)local_20[1]);
    local_10[1] = (float)((int)fVar4 + -1 + (uint)(fVar4 <= 0.0) * 2);
  }
  auVar2 = vmovshdup_avx(auVar9._0_16_);
  local_20[2] = auVar2._0_4_ * this->low;
  local_10[2] = local_20[2];
  if (-INFINITY < local_20[2]) {
    uVar3 = vcmpss_avx512f(ZEXT416((uint)local_20[2]),ZEXT816(0),0);
    bVar5 = (bool)((byte)uVar3 & 1);
    fVar4 = (float)((uint)bVar5 * -0x80000000 + (uint)!bVar5 * (int)local_20[2]);
    local_10[2] = (float)((int)fVar4 + -1 + (uint)(fVar4 <= 0.0) * 2);
  }
  local_20[3] = auVar2._0_4_ * this->high;
  local_10[3] = local_20[3];
  if (-INFINITY < local_20[3]) {
    uVar3 = vcmpss_avx512f(ZEXT416((uint)local_20[3]),ZEXT816(0),0);
    bVar5 = (bool)((byte)uVar3 & 1);
    fVar4 = (float)((uint)bVar5 * -0x80000000 + (uint)!bVar5 * (int)local_20[3]);
    local_10[3] = (float)((int)fVar4 + -1 + (uint)(fVar4 <= 0.0) * 2);
  }
  if (local_20[0] < INFINITY) {
    uVar3 = vcmpss_avx512f(ZEXT416((uint)local_20[0]),ZEXT816(0),0);
    local_20[0] = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)local_20[0]);
    local_20[0] = (float)((-(uint)(local_20[0] < 0.0) | 1) + (int)local_20[0]);
  }
  if (local_20[1] < INFINITY) {
    uVar3 = vcmpss_avx512f(ZEXT416((uint)local_20[1]),ZEXT816(0) << 0x40,0);
    local_20[1] = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)local_20[1]);
    local_20[1] = (float)((-(uint)(local_20[1] < 0.0) | 1) + (int)local_20[1]);
  }
  if (local_20[2] < INFINITY) {
    uVar3 = vcmpss_avx512f(ZEXT416((uint)local_20[2]),ZEXT816(0) << 0x40,0);
    local_20[2] = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)local_20[2]);
    local_20[2] = (float)((-(uint)(local_20[2] < 0.0) | 1) + (int)local_20[2]);
  }
  if (local_20[3] < INFINITY) {
    uVar3 = vcmpss_avx512f(ZEXT416((uint)local_20[3]),ZEXT816(0) << 0x40,0);
    local_20[3] = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)local_20[3]);
    local_20[3] = (float)((-(uint)(local_20[3] < 0.0) | 1) + (int)local_20[3]);
  }
  pfVar6 = local_10;
  lVar8 = 4;
  do {
    if (*(float *)((long)local_10 + lVar8) < *pfVar6) {
      pfVar6 = (float *)((long)local_10 + lVar8);
    }
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x10);
  pfVar7 = local_20;
  lVar8 = 4;
  do {
    if (*pfVar7 < *(float *)((long)local_20 + lVar8)) {
      pfVar7 = (float *)((long)local_20 + lVar8);
    }
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x10);
  auVar1 = vminss_avx(ZEXT416((uint)*pfVar7),ZEXT416((uint)*pfVar6));
  auVar2 = vmaxss_avx(ZEXT416((uint)*pfVar7),ZEXT416((uint)*pfVar6));
  auVar2 = vinsertps_avx(auVar1,auVar2,0x10);
  return auVar2._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Interval operator*(Interval i) const {
        Float lp[4] = {MulRoundDown(low, i.low), MulRoundDown(high, i.low),
                       MulRoundDown(low, i.high), MulRoundDown(high, i.high)};
        Float hp[4] = {MulRoundUp(low, i.low), MulRoundUp(high, i.low),
                       MulRoundUp(low, i.high), MulRoundUp(high, i.high)};
        return {std::min({lp[0], lp[1], lp[2], lp[3]}),
                std::max({hp[0], hp[1], hp[2], hp[3]})};
    }